

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getpart.c
# Opt level: O1

int getpart(char **outbuf,size_t *outlen,char *main,char *sub,FILE *stream)

{
  bool bVar1;
  size_t sVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  char *pcVar7;
  byte *__s;
  size_t sVar8;
  void *pvVar9;
  long lVar10;
  byte *pbVar11;
  size_t uznum;
  byte *pbVar12;
  bool bVar13;
  size_t outalloc;
  char ptag [80];
  char csub [80];
  char cmain [80];
  char patt [80];
  char couter [80];
  int local_208;
  int local_200;
  uint local_1fc;
  size_t local_1e8;
  char *local_1e0;
  char *local_1d8;
  FILE *local_1d0;
  char local_1c8 [80];
  char local_178 [80];
  char local_128 [80];
  char local_d8 [80];
  char local_88 [88];
  
  local_1e8 = 0x100;
  *outlen = 0;
  local_1d0 = (FILE *)stream;
  pcVar7 = (char *)(*Curl_cmalloc)(0x100);
  *outbuf = pcVar7;
  local_1fc = 0xffffffff;
  if (pcVar7 != (char *)0x0) {
    __s = (byte *)0x0;
    *pcVar7 = '\0';
    local_d8[0] = '\0';
    local_1c8[0] = '\0';
    local_178[0] = '\0';
    local_128[0] = '\0';
    local_88[0] = '\0';
    bVar1 = true;
    uznum = 0;
    local_200 = 0;
    local_208 = 0;
    local_1e0 = sub;
    local_1d8 = main;
LAB_00103ee2:
    do {
      sVar2 = uznum;
      if (__s == (byte *)0x0) {
        __s = (byte *)(*Curl_cmalloc)(0x80);
        sVar2 = 0x80;
        if (__s != (byte *)0x0) goto LAB_00103f07;
        uVar5 = 0xffffffff;
      }
      else {
LAB_00103f07:
        uznum = sVar2;
        iVar4 = curlx_uztosi(uznum);
        pcVar7 = fgets((char *)__s,iVar4,local_1d0);
        if (pcVar7 != (char *)0x0) {
          sVar8 = strlen((char *)__s);
          lVar10 = 2;
          if ((__s[sVar8 - 1] != 10) && (lVar10 = 3, uznum - 1 <= sVar8)) {
            pvVar9 = (*Curl_crealloc)(__s,uznum * 2);
            if (pvVar9 == (void *)0x0) {
              lVar10 = 1;
            }
            else {
              lVar10 = 0;
            }
          }
          iVar4 = (*(code *)((long)&DAT_00106220 + (long)(int)(&DAT_00106220)[lVar10]))();
          return iVar4;
        }
        uVar5 = 1;
      }
      if (uVar5 != 0) goto LAB_0010434e;
      bVar3 = *__s;
      pbVar12 = __s;
      while ((bVar3 != 0 && (iVar4 = Curl_isspace((uint)bVar3), iVar4 != 0))) {
        bVar3 = pbVar12[1];
        pbVar12 = pbVar12 + 1;
      }
      if (*pbVar12 == 0x3c) {
        if (pbVar12[1] == 0x2f) {
          bVar3 = pbVar12[2];
          pbVar12 = pbVar12 + 2;
          for (pbVar11 = pbVar12;
              ((bVar3 != 0 && (iVar4 = Curl_isspace((uint)bVar3), iVar4 == 0)) && (*pbVar11 != 0x3e)
              ); pbVar11 = pbVar11 + 1) {
            bVar3 = pbVar11[1];
          }
          sVar8 = (long)pbVar11 - (long)pbVar12;
          if (0x4f < (long)sVar8) {
            uVar5 = 0xfffffffe;
            goto LAB_0010434e;
          }
          memcpy(local_1c8,pbVar12,sVar8);
          local_1c8[sVar8] = '\0';
          if (local_208 == 1) {
            iVar4 = strcmp(local_88,local_1c8);
            local_208 = 1;
            if (iVar4 == 0) {
              local_88[0] = '\0';
              local_208 = 0;
              uVar5 = 0;
              if (!bVar1) goto LAB_0010434e;
            }
          }
          else if (local_208 == 2) {
            iVar4 = strcmp(local_128,local_1c8);
            if (iVar4 == 0) {
              local_128[0] = '\0';
              local_208 = 1;
              if (!bVar1) {
                uVar5 = 0;
                if (local_200 != 0) {
                  uVar6 = decodedata(outbuf,outlen);
                  goto LAB_001043e0;
                }
                goto LAB_0010434e;
              }
            }
          }
          else if ((local_208 == 3) && (iVar4 = strcmp(local_178,local_1c8), iVar4 == 0)) {
            local_178[0] = '\0';
            local_208 = 2;
            if (!bVar1) {
              uVar5 = 0;
              if (local_200 != 0) {
                uVar6 = decodedata(outbuf,outlen);
                local_1fc = uVar6;
LAB_001043e0:
                uVar5 = 0;
                if (uVar6 != 0) {
                  return local_1fc;
                }
              }
              goto LAB_0010434e;
            }
          }
        }
        else if (bVar1) {
          pbVar12 = pbVar12 + 1;
          bVar3 = *pbVar12;
          for (pbVar11 = pbVar12;
              ((bVar3 != 0 && (iVar4 = Curl_isspace((uint)bVar3), iVar4 == 0)) && (*pbVar11 != 0x3e)
              ); pbVar11 = pbVar11 + 1) {
            bVar3 = pbVar11[1];
          }
          sVar8 = (long)pbVar11 - (long)pbVar12;
          uVar5 = 0xfffffffe;
          if (0x4f < (long)sVar8) goto LAB_0010434e;
          memcpy(local_1c8,pbVar12,sVar8);
          local_1c8[sVar8] = '\0';
          if ((local_1c8[0] != '!') && (local_1c8[0] != '?')) {
            bVar3 = *pbVar11;
            while ((bVar3 != 0 && (iVar4 = Curl_isspace((uint)bVar3), iVar4 != 0))) {
              bVar3 = pbVar11[1];
              pbVar11 = pbVar11 + 1;
            }
            for (sVar8 = 0; (pbVar11[sVar8] != 0 && (pbVar11[sVar8] != 0x3e)); sVar8 = sVar8 + 1) {
            }
            if (0x4f < (long)sVar8) goto LAB_0010434e;
            memcpy(local_d8,pbVar11,sVar8);
            local_d8[sVar8] = '\0';
            if (local_208 == 2) {
              strcpy(local_178,local_1c8);
              iVar4 = strcmp(local_128,local_1d8);
              local_208 = 3;
              bVar1 = true;
              if ((iVar4 == 0) && (iVar4 = strcmp(local_178,local_1e0), iVar4 == 0)) {
                pcVar7 = strstr(local_d8,"base64=");
                if (pcVar7 != (char *)0x0) {
                  local_200 = 1;
                }
                local_208 = 3;
                bVar1 = false;
              }
              goto LAB_00103ee2;
            }
            if (local_208 == 1) {
              local_208 = 2;
              pcVar7 = local_128;
            }
            else {
              bVar13 = local_208 != 0;
              local_208 = 3;
              if (bVar13) goto LAB_00104262;
              local_208 = 1;
              pcVar7 = local_88;
            }
            strcpy(pcVar7,local_1c8);
          }
          bVar1 = true;
          goto LAB_00103ee2;
        }
LAB_00104262:
        if ((!bVar1) &&
           (uVar5 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_200), uVar5 != 0))
        goto LAB_0010434e;
        goto LAB_00103ee2;
      }
    } while ((bVar1) ||
            (iVar4 = appenddata(outbuf,outlen,&local_1e8,(char *)__s,local_200), iVar4 == 0));
    uVar5 = 0xffffffff;
LAB_0010434e:
    (*Curl_cfree)(__s);
    local_1fc = 0;
    if (1 < uVar5) {
      (*Curl_cfree)(*outbuf);
      *outbuf = (char *)0x0;
      *outlen = 0;
      local_1fc = uVar5;
    }
  }
  return local_1fc;
}

Assistant:

int getpart(char **outbuf, size_t *outlen,
            const char *main, const char *sub, FILE *stream)
{
# define MAX_TAG_LEN 79
  char couter[MAX_TAG_LEN + 1]; /* current outermost section */
  char cmain[MAX_TAG_LEN + 1];  /* current main section */
  char csub[MAX_TAG_LEN + 1];   /* current sub section */
  char ptag[MAX_TAG_LEN + 1];   /* potential tag */
  char patt[MAX_TAG_LEN + 1];   /* potential attributes */
  char *buffer = NULL;
  char *ptr;
  char *end;
  union {
    ssize_t sig;
     size_t uns;
  } len;
  size_t bufsize = 0;
  size_t outalloc = 256;
  int in_wanted_part = 0;
  int base64 = 0;
  int error;

  enum {
    STATE_OUTSIDE = 0,
    STATE_OUTER   = 1,
    STATE_INMAIN  = 2,
    STATE_INSUB   = 3,
    STATE_ILLEGAL = 4
  } state = STATE_OUTSIDE;

  *outlen = 0;
  *outbuf = malloc(outalloc);
  if(!*outbuf)
    return GPE_OUT_OF_MEMORY;
  *(*outbuf) = '\0';

  couter[0] = cmain[0] = csub[0] = ptag[0] = patt[0] = '\0';

  while((error = readline(&buffer, &bufsize, stream)) == GPE_OK) {

    ptr = buffer;
    EAT_SPACE(ptr);

    if('<' != *ptr) {
      if(in_wanted_part) {
        show(("=> %s", buffer));
        error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
        if(error)
          break;
      }
      continue;
    }

    ptr++;

    if('/' == *ptr) {
      /*
      ** closing section tag
      */

      ptr++;
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      if((STATE_INSUB == state) && !strcmp(csub, ptag)) {
        /* end of current sub section */
        state = STATE_INMAIN;
        csub[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_INMAIN == state) && !strcmp(cmain, ptag)) {
        /* end of current main section */
        state = STATE_OUTER;
        cmain[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;

          /* Do we need to base64 decode the data? */
          if(base64) {
            error = decodedata(outbuf, outlen);
            if(error)
              return error;
          }
          break;
        }
      }
      else if((STATE_OUTER == state) && !strcmp(couter, ptag)) {
        /* end of outermost file section */
        state = STATE_OUTSIDE;
        couter[0] = '\0';
        if(in_wanted_part) {
          /* end of wanted part */
          in_wanted_part = 0;
          break;
        }
      }

    }
    else if(!in_wanted_part) {
      /*
      ** opening section tag
      */

      /* get potential tag */
      end = ptr;
      EAT_WORD(end);
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(ptag, ptr, len.uns);
      ptag[len.uns] = '\0';

      /* ignore comments, doctypes and xml declarations */
      if(('!' == ptag[0]) || ('?' == ptag[0])) {
        show(("* ignoring (%s)", buffer));
        continue;
      }

      /* get all potential attributes */
      ptr = end;
      EAT_SPACE(ptr);
      end = ptr;
      while(*end && ('>' != *end))
        end++;
      len.sig = end - ptr;
      if(len.sig > MAX_TAG_LEN) {
        error = GPE_NO_BUFFER_SPACE;
        break;
      }
      memcpy(patt, ptr, len.uns);
      patt[len.uns] = '\0';

      if(STATE_OUTSIDE == state) {
        /* outermost element (<testcase>) */
        strcpy(couter, ptag);
        state = STATE_OUTER;
        continue;
      }
      else if(STATE_OUTER == state) {
        /* start of a main section */
        strcpy(cmain, ptag);
        state = STATE_INMAIN;
        continue;
      }
      else if(STATE_INMAIN == state) {
        /* start of a sub section */
        strcpy(csub, ptag);
        state = STATE_INSUB;
        if(!strcmp(cmain, main) && !strcmp(csub, sub)) {
          /* start of wanted part */
          in_wanted_part = 1;
          if(strstr(patt, "base64="))
              /* bit rough test, but "mostly" functional, */
              /* treat wanted part data as base64 encoded */
              base64 = 1;
        }
        continue;
      }

    }

    if(in_wanted_part) {
      show(("=> %s", buffer));
      error = appenddata(outbuf, outlen, &outalloc, buffer, base64);
      if(error)
        break;
    }

  } /* while */

  free(buffer);

  if(error != GPE_OK) {
    if(error == GPE_END_OF_FILE)
      error = GPE_OK;
    else {
      free(*outbuf);
      *outbuf = NULL;
      *outlen = 0;
    }
  }

  return error;
}